

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

ClockingAssertionExpr * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ClockingAssertionExpr,slang::ast::TimingControl&,slang::ast::AssertionExpr_const&>
          (BumpAllocator *this,TimingControl *args,AssertionExpr *args_1)

{
  ClockingAssertionExpr *this_00;
  AssertionExpr *args_local_1;
  TimingControl *args_local;
  BumpAllocator *this_local;
  
  this_00 = (ClockingAssertionExpr *)allocate(this,0x20,8);
  ast::ClockingAssertionExpr::ClockingAssertionExpr(this_00,args,args_1);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }